

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_alpn_set_negotiated
                   (Curl_cfilter *cf,Curl_easy *data,ssl_connect_data *connssl,uchar *proto,
                   size_t proto_len)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  char *pcVar5;
  uchar *local_50;
  uchar *palpn;
  CURLcode result;
  size_t proto_len_local;
  uchar *proto_local;
  ssl_connect_data *connssl_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  palpn._4_4_ = CURLE_OK;
  if ((((ulong)cf->conn->bits >> 3 & 1) == 0) || (_Var1 = Curl_ssl_cf_is_proxy(cf), !_Var1)) {
    local_50 = &cf->conn->alpn;
  }
  else {
    local_50 = &cf->conn->proxy_alpn;
  }
  if ((connssl->negotiated).alpn == (char *)0x0) {
    if ((proto != (uchar *)0x0) && (proto_len != 0)) {
      pvVar4 = memchr(proto,0,proto_len);
      if (pvVar4 != (void *)0x0) {
        Curl_failf(data,"ALPN: server selected protocol contains NUL. Refusing to continue.");
        return CURLE_SSL_CONNECT_ERROR;
      }
      pcVar5 = (char *)(*Curl_cmalloc)(proto_len + 1);
      (connssl->negotiated).alpn = pcVar5;
      if ((connssl->negotiated).alpn == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy((connssl->negotiated).alpn,proto,proto_len);
      (connssl->negotiated).alpn[proto_len] = '\0';
    }
    if ((proto == (uchar *)0x0) || (proto_len == 0)) {
      *local_50 = '\0';
      if (connssl->state == ssl_connection_deferred) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"ALPN: deferred handshake for early data without specific protocol.");
        }
      }
      else if (((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
        Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
      }
    }
    else if ((proto_len == 8) && (*(long *)proto == 0x312e312f70747468)) {
      *local_50 = '\x02';
      if (connssl->state == ssl_connection_deferred) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"ALPN: deferred handshake for early data using \'%.*s\'.",8,proto);
        }
      }
      else if (((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
        Curl_infof(data,"ALPN: server accepted %.*s",8,proto);
      }
    }
    else {
      *local_50 = '\0';
      Curl_failf(data,"unsupported ALPN protocol: \'%.*s\'",proto_len & 0xffffffff,proto);
    }
  }
  else if (proto_len == 0) {
    Curl_failf(data,
               "ALPN: asked for \'%s\' from previous session, but server did not confirm it. Refusing to continue."
               ,(connssl->negotiated).alpn);
    palpn._4_4_ = CURLE_SSL_CONNECT_ERROR;
  }
  else {
    sVar3 = strlen((connssl->negotiated).alpn);
    if ((sVar3 == proto_len) &&
       (iVar2 = memcmp((connssl->negotiated).alpn,proto,proto_len), iVar2 == 0)) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"ALPN: server confirmed to use \'%s\'",(connssl->negotiated).alpn);
      }
    }
    else {
      Curl_failf(data,
                 "ALPN: asked for \'%s\' from previous session, but server selected \'%.*s\'. Refusing to continue."
                 ,(connssl->negotiated).alpn,proto_len & 0xffffffff,proto);
      palpn._4_4_ = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return palpn._4_4_;
}

Assistant:

CURLcode Curl_alpn_set_negotiated(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct ssl_connect_data *connssl,
                                  const unsigned char *proto,
                                  size_t proto_len)
{
  CURLcode result = CURLE_OK;
  unsigned char *palpn =
#ifndef CURL_DISABLE_PROXY
    (cf->conn->bits.tunnel_proxy && Curl_ssl_cf_is_proxy(cf)) ?
    &cf->conn->proxy_alpn : &cf->conn->alpn
#else
    &cf->conn->alpn
#endif
    ;

  if(connssl->negotiated.alpn) {
    /* When we ask for a specific ALPN protocol, we need the confirmation
     * of it by the server, as we have installed protocol handler and
     * connection filter chain for exactly this protocol. */
    if(!proto_len) {
      failf(data, "ALPN: asked for '%s' from previous session, "
            "but server did not confirm it. Refusing to continue.",
            connssl->negotiated.alpn);
      result = CURLE_SSL_CONNECT_ERROR;
      goto out;
    }
    else if((strlen(connssl->negotiated.alpn) != proto_len) ||
            memcmp(connssl->negotiated.alpn, proto, proto_len)) {
      failf(data, "ALPN: asked for '%s' from previous session, but server "
            "selected '%.*s'. Refusing to continue.",
            connssl->negotiated.alpn, (int)proto_len, proto);
      result = CURLE_SSL_CONNECT_ERROR;
      goto out;
    }
    /* ALPN is exactly what we asked for, done. */
    infof(data, "ALPN: server confirmed to use '%s'",
          connssl->negotiated.alpn);
    goto out;
  }

  if(proto && proto_len) {
    if(memchr(proto, '\0', proto_len)) {
      failf(data, "ALPN: server selected protocol contains NUL. "
            "Refusing to continue.");
      result = CURLE_SSL_CONNECT_ERROR;
      goto out;
    }
    connssl->negotiated.alpn = malloc(proto_len + 1);
    if(!connssl->negotiated.alpn)
      return CURLE_OUT_OF_MEMORY;
    memcpy(connssl->negotiated.alpn, proto, proto_len);
    connssl->negotiated.alpn[proto_len] = 0;
  }

  if(proto && proto_len) {
    if(proto_len == ALPN_HTTP_1_1_LENGTH &&
       !memcmp(ALPN_HTTP_1_1, proto, ALPN_HTTP_1_1_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_1_1;
    }
#ifdef USE_HTTP2
    else if(proto_len == ALPN_H2_LENGTH &&
            !memcmp(ALPN_H2, proto, ALPN_H2_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_2;
    }
#endif
#ifdef USE_HTTP3
    else if(proto_len == ALPN_H3_LENGTH &&
            !memcmp(ALPN_H3, proto, ALPN_H3_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_3;
    }
#endif
    else {
      *palpn = CURL_HTTP_VERSION_NONE;
      failf(data, "unsupported ALPN protocol: '%.*s'", (int)proto_len, proto);
      /* Previous code just ignored it and some vtls backends even ignore the
       * return code of this function. */
      /* return CURLE_NOT_BUILT_IN; */
      goto out;
    }

    if(connssl->state == ssl_connection_deferred)
      infof(data, VTLS_INFOF_ALPN_DEFERRED, (int)proto_len, proto);
    else
      infof(data, VTLS_INFOF_ALPN_ACCEPTED, (int)proto_len, proto);
  }
  else {
    *palpn = CURL_HTTP_VERSION_NONE;
    if(connssl->state == ssl_connection_deferred)
      infof(data, VTLS_INFOF_NO_ALPN_DEFERRED);
    else
      infof(data, VTLS_INFOF_NO_ALPN);
  }

out:
  return result;
}